

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_init.c
# Opt level: O0

void createKeyTables(void)

{
  int scancode;
  undefined8 uStack_8;
  
  memset(_glfw.wl.keycodes,0xff,0x200);
  memset(_glfw.wl.scancodes,0xff,0x2ba);
  _glfw.wl.keycodes[0x29] = 0x60;
  _glfw.wl.keycodes[2] = 0x31;
  _glfw.wl.keycodes[3] = 0x32;
  _glfw.wl.keycodes[4] = 0x33;
  _glfw.wl.keycodes[5] = 0x34;
  _glfw.wl.keycodes[6] = 0x35;
  _glfw.wl.keycodes[7] = 0x36;
  _glfw.wl.keycodes[8] = 0x37;
  _glfw.wl.keycodes[9] = 0x38;
  _glfw.wl.keycodes[10] = 0x39;
  _glfw.wl.keycodes[0xb] = 0x30;
  _glfw.wl.keycodes[0x39] = 0x20;
  _glfw.wl.keycodes[0xc] = 0x2d;
  _glfw.wl.keycodes[0xd] = 0x3d;
  _glfw.wl.keycodes[0x10] = 0x51;
  _glfw.wl.keycodes[0x11] = 0x57;
  _glfw.wl.keycodes[0x12] = 0x45;
  _glfw.wl.keycodes[0x13] = 0x52;
  _glfw.wl.keycodes[0x14] = 0x54;
  _glfw.wl.keycodes[0x15] = 0x59;
  _glfw.wl.keycodes[0x16] = 0x55;
  _glfw.wl.keycodes[0x17] = 0x49;
  _glfw.wl.keycodes[0x18] = 0x4f;
  _glfw.wl.keycodes[0x19] = 0x50;
  _glfw.wl.keycodes[0x1a] = 0x5b;
  _glfw.wl.keycodes[0x1b] = 0x5d;
  _glfw.wl.keycodes[0x1e] = 0x41;
  _glfw.wl.keycodes[0x1f] = 0x53;
  _glfw.wl.keycodes[0x20] = 0x44;
  _glfw.wl.keycodes[0x21] = 0x46;
  _glfw.wl.keycodes[0x22] = 0x47;
  _glfw.wl.keycodes[0x23] = 0x48;
  _glfw.wl.keycodes[0x24] = 0x4a;
  _glfw.wl.keycodes[0x25] = 0x4b;
  _glfw.wl.keycodes[0x26] = 0x4c;
  _glfw.wl.keycodes[0x27] = 0x3b;
  _glfw.wl.keycodes[0x28] = 0x27;
  _glfw.wl.keycodes[0x2c] = 0x5a;
  _glfw.wl.keycodes[0x2d] = 0x58;
  _glfw.wl.keycodes[0x2e] = 0x43;
  _glfw.wl.keycodes[0x2f] = 0x56;
  _glfw.wl.keycodes[0x30] = 0x42;
  _glfw.wl.keycodes[0x31] = 0x4e;
  _glfw.wl.keycodes[0x32] = 0x4d;
  _glfw.wl.keycodes[0x33] = 0x2c;
  _glfw.wl.keycodes[0x34] = 0x2e;
  _glfw.wl.keycodes[0x35] = 0x2f;
  _glfw.wl.keycodes[0x2b] = 0x5c;
  _glfw.wl.keycodes[1] = 0x100;
  _glfw.wl.keycodes[0xf] = 0x102;
  _glfw.wl.keycodes[0x2a] = 0x154;
  _glfw.wl.keycodes[0x36] = 0x158;
  _glfw.wl.keycodes[0x1d] = 0x155;
  _glfw.wl.keycodes[0x61] = 0x159;
  _glfw.wl.keycodes[0x38] = 0x156;
  _glfw.wl.keycodes[100] = 0x15a;
  _glfw.wl.keycodes[0x7d] = 0x157;
  _glfw.wl.keycodes[0x7e] = 0x15b;
  _glfw.wl.keycodes[0x7f] = 0x15c;
  _glfw.wl.keycodes[0x45] = 0x11a;
  _glfw.wl.keycodes[0x3a] = 0x118;
  _glfw.wl.keycodes[0xd2] = 0x11b;
  _glfw.wl.keycodes[0x46] = 0x119;
  _glfw.wl.keycodes[0x77] = 0x11c;
  _glfw.wl.keycodes[0x6f] = 0x105;
  _glfw.wl.keycodes[0xe] = 0x103;
  _glfw.wl.keycodes[0x1c] = 0x101;
  _glfw.wl.keycodes[0x66] = 0x10c;
  _glfw.wl.keycodes[0x6b] = 0x10d;
  _glfw.wl.keycodes[0x68] = 0x10a;
  _glfw.wl.keycodes[0x6d] = 0x10b;
  _glfw.wl.keycodes[0x6e] = 0x104;
  _glfw.wl.keycodes[0x69] = 0x107;
  _glfw.wl.keycodes[0x6a] = 0x106;
  _glfw.wl.keycodes[0x6c] = 0x108;
  _glfw.wl.keycodes[0x67] = 0x109;
  _glfw.wl.keycodes[0x3b] = 0x122;
  _glfw.wl.keycodes[0x3c] = 0x123;
  _glfw.wl.keycodes[0x3d] = 0x124;
  _glfw.wl.keycodes[0x3e] = 0x125;
  _glfw.wl.keycodes[0x3f] = 0x126;
  _glfw.wl.keycodes[0x40] = 0x127;
  _glfw.wl.keycodes[0x41] = 0x128;
  _glfw.wl.keycodes[0x42] = 0x129;
  _glfw.wl.keycodes[0x43] = 0x12a;
  _glfw.wl.keycodes[0x44] = 299;
  _glfw.wl.keycodes[0x57] = 300;
  _glfw.wl.keycodes[0x58] = 0x12d;
  _glfw.wl.keycodes[0xb7] = 0x12e;
  _glfw.wl.keycodes[0xb8] = 0x12f;
  _glfw.wl.keycodes[0xb9] = 0x130;
  _glfw.wl.keycodes[0xba] = 0x131;
  _glfw.wl.keycodes[0xbb] = 0x132;
  _glfw.wl.keycodes[0xbc] = 0x133;
  _glfw.wl.keycodes[0xbd] = 0x134;
  _glfw.wl.keycodes[0xbe] = 0x135;
  _glfw.wl.keycodes[0xbf] = 0x136;
  _glfw.wl.keycodes[0xc0] = 0x137;
  _glfw.wl.keycodes[0xc1] = 0x138;
  _glfw.wl.keycodes[0xc2] = 0x139;
  _glfw.wl.keycodes[0x62] = 0x14b;
  _glfw.wl.keycodes[0x37] = 0x14c;
  _glfw.wl.keycodes[0x4a] = 0x14d;
  _glfw.wl.keycodes[0x4e] = 0x14e;
  _glfw.wl.keycodes[0x52] = 0x140;
  _glfw.wl.keycodes[0x4f] = 0x141;
  _glfw.wl.keycodes[0x50] = 0x142;
  _glfw.wl.keycodes[0x51] = 0x143;
  _glfw.wl.keycodes[0x4b] = 0x144;
  _glfw.wl.keycodes[0x4c] = 0x145;
  _glfw.wl.keycodes[0x4d] = 0x146;
  _glfw.wl.keycodes[0x47] = 0x147;
  _glfw.wl.keycodes[0x48] = 0x148;
  _glfw.wl.keycodes[0x49] = 0x149;
  _glfw.wl.keycodes[0x53] = 0x14a;
  _glfw.wl.keycodes[0x75] = 0x150;
  _glfw.wl.keycodes[0x60] = 0x14f;
  _glfw.wl.keycodes[0x56] = 0xa2;
  uStack_8 = 0;
  while (uStack_8._4_4_ < 0x100) {
    if (0 < _glfw.wl.keycodes[uStack_8._4_4_]) {
      _glfw.wl.scancodes[_glfw.wl.keycodes[uStack_8._4_4_]] = (short)((ulong)uStack_8 >> 0x20);
    }
    uStack_8 = (ulong)(uStack_8._4_4_ + 1) << 0x20;
  }
  return;
}

Assistant:

static void createKeyTables(void)
{
    memset(_glfw.wl.keycodes, -1, sizeof(_glfw.wl.keycodes));
    memset(_glfw.wl.scancodes, -1, sizeof(_glfw.wl.scancodes));

    _glfw.wl.keycodes[KEY_GRAVE]      = GLFW_KEY_GRAVE_ACCENT;
    _glfw.wl.keycodes[KEY_1]          = GLFW_KEY_1;
    _glfw.wl.keycodes[KEY_2]          = GLFW_KEY_2;
    _glfw.wl.keycodes[KEY_3]          = GLFW_KEY_3;
    _glfw.wl.keycodes[KEY_4]          = GLFW_KEY_4;
    _glfw.wl.keycodes[KEY_5]          = GLFW_KEY_5;
    _glfw.wl.keycodes[KEY_6]          = GLFW_KEY_6;
    _glfw.wl.keycodes[KEY_7]          = GLFW_KEY_7;
    _glfw.wl.keycodes[KEY_8]          = GLFW_KEY_8;
    _glfw.wl.keycodes[KEY_9]          = GLFW_KEY_9;
    _glfw.wl.keycodes[KEY_0]          = GLFW_KEY_0;
    _glfw.wl.keycodes[KEY_SPACE]      = GLFW_KEY_SPACE;
    _glfw.wl.keycodes[KEY_MINUS]      = GLFW_KEY_MINUS;
    _glfw.wl.keycodes[KEY_EQUAL]      = GLFW_KEY_EQUAL;
    _glfw.wl.keycodes[KEY_Q]          = GLFW_KEY_Q;
    _glfw.wl.keycodes[KEY_W]          = GLFW_KEY_W;
    _glfw.wl.keycodes[KEY_E]          = GLFW_KEY_E;
    _glfw.wl.keycodes[KEY_R]          = GLFW_KEY_R;
    _glfw.wl.keycodes[KEY_T]          = GLFW_KEY_T;
    _glfw.wl.keycodes[KEY_Y]          = GLFW_KEY_Y;
    _glfw.wl.keycodes[KEY_U]          = GLFW_KEY_U;
    _glfw.wl.keycodes[KEY_I]          = GLFW_KEY_I;
    _glfw.wl.keycodes[KEY_O]          = GLFW_KEY_O;
    _glfw.wl.keycodes[KEY_P]          = GLFW_KEY_P;
    _glfw.wl.keycodes[KEY_LEFTBRACE]  = GLFW_KEY_LEFT_BRACKET;
    _glfw.wl.keycodes[KEY_RIGHTBRACE] = GLFW_KEY_RIGHT_BRACKET;
    _glfw.wl.keycodes[KEY_A]          = GLFW_KEY_A;
    _glfw.wl.keycodes[KEY_S]          = GLFW_KEY_S;
    _glfw.wl.keycodes[KEY_D]          = GLFW_KEY_D;
    _glfw.wl.keycodes[KEY_F]          = GLFW_KEY_F;
    _glfw.wl.keycodes[KEY_G]          = GLFW_KEY_G;
    _glfw.wl.keycodes[KEY_H]          = GLFW_KEY_H;
    _glfw.wl.keycodes[KEY_J]          = GLFW_KEY_J;
    _glfw.wl.keycodes[KEY_K]          = GLFW_KEY_K;
    _glfw.wl.keycodes[KEY_L]          = GLFW_KEY_L;
    _glfw.wl.keycodes[KEY_SEMICOLON]  = GLFW_KEY_SEMICOLON;
    _glfw.wl.keycodes[KEY_APOSTROPHE] = GLFW_KEY_APOSTROPHE;
    _glfw.wl.keycodes[KEY_Z]          = GLFW_KEY_Z;
    _glfw.wl.keycodes[KEY_X]          = GLFW_KEY_X;
    _glfw.wl.keycodes[KEY_C]          = GLFW_KEY_C;
    _glfw.wl.keycodes[KEY_V]          = GLFW_KEY_V;
    _glfw.wl.keycodes[KEY_B]          = GLFW_KEY_B;
    _glfw.wl.keycodes[KEY_N]          = GLFW_KEY_N;
    _glfw.wl.keycodes[KEY_M]          = GLFW_KEY_M;
    _glfw.wl.keycodes[KEY_COMMA]      = GLFW_KEY_COMMA;
    _glfw.wl.keycodes[KEY_DOT]        = GLFW_KEY_PERIOD;
    _glfw.wl.keycodes[KEY_SLASH]      = GLFW_KEY_SLASH;
    _glfw.wl.keycodes[KEY_BACKSLASH]  = GLFW_KEY_BACKSLASH;
    _glfw.wl.keycodes[KEY_ESC]        = GLFW_KEY_ESCAPE;
    _glfw.wl.keycodes[KEY_TAB]        = GLFW_KEY_TAB;
    _glfw.wl.keycodes[KEY_LEFTSHIFT]  = GLFW_KEY_LEFT_SHIFT;
    _glfw.wl.keycodes[KEY_RIGHTSHIFT] = GLFW_KEY_RIGHT_SHIFT;
    _glfw.wl.keycodes[KEY_LEFTCTRL]   = GLFW_KEY_LEFT_CONTROL;
    _glfw.wl.keycodes[KEY_RIGHTCTRL]  = GLFW_KEY_RIGHT_CONTROL;
    _glfw.wl.keycodes[KEY_LEFTALT]    = GLFW_KEY_LEFT_ALT;
    _glfw.wl.keycodes[KEY_RIGHTALT]   = GLFW_KEY_RIGHT_ALT;
    _glfw.wl.keycodes[KEY_LEFTMETA]   = GLFW_KEY_LEFT_SUPER;
    _glfw.wl.keycodes[KEY_RIGHTMETA]  = GLFW_KEY_RIGHT_SUPER;
    _glfw.wl.keycodes[KEY_COMPOSE]    = GLFW_KEY_MENU;
    _glfw.wl.keycodes[KEY_NUMLOCK]    = GLFW_KEY_NUM_LOCK;
    _glfw.wl.keycodes[KEY_CAPSLOCK]   = GLFW_KEY_CAPS_LOCK;
    _glfw.wl.keycodes[KEY_PRINT]      = GLFW_KEY_PRINT_SCREEN;
    _glfw.wl.keycodes[KEY_SCROLLLOCK] = GLFW_KEY_SCROLL_LOCK;
    _glfw.wl.keycodes[KEY_PAUSE]      = GLFW_KEY_PAUSE;
    _glfw.wl.keycodes[KEY_DELETE]     = GLFW_KEY_DELETE;
    _glfw.wl.keycodes[KEY_BACKSPACE]  = GLFW_KEY_BACKSPACE;
    _glfw.wl.keycodes[KEY_ENTER]      = GLFW_KEY_ENTER;
    _glfw.wl.keycodes[KEY_HOME]       = GLFW_KEY_HOME;
    _glfw.wl.keycodes[KEY_END]        = GLFW_KEY_END;
    _glfw.wl.keycodes[KEY_PAGEUP]     = GLFW_KEY_PAGE_UP;
    _glfw.wl.keycodes[KEY_PAGEDOWN]   = GLFW_KEY_PAGE_DOWN;
    _glfw.wl.keycodes[KEY_INSERT]     = GLFW_KEY_INSERT;
    _glfw.wl.keycodes[KEY_LEFT]       = GLFW_KEY_LEFT;
    _glfw.wl.keycodes[KEY_RIGHT]      = GLFW_KEY_RIGHT;
    _glfw.wl.keycodes[KEY_DOWN]       = GLFW_KEY_DOWN;
    _glfw.wl.keycodes[KEY_UP]         = GLFW_KEY_UP;
    _glfw.wl.keycodes[KEY_F1]         = GLFW_KEY_F1;
    _glfw.wl.keycodes[KEY_F2]         = GLFW_KEY_F2;
    _glfw.wl.keycodes[KEY_F3]         = GLFW_KEY_F3;
    _glfw.wl.keycodes[KEY_F4]         = GLFW_KEY_F4;
    _glfw.wl.keycodes[KEY_F5]         = GLFW_KEY_F5;
    _glfw.wl.keycodes[KEY_F6]         = GLFW_KEY_F6;
    _glfw.wl.keycodes[KEY_F7]         = GLFW_KEY_F7;
    _glfw.wl.keycodes[KEY_F8]         = GLFW_KEY_F8;
    _glfw.wl.keycodes[KEY_F9]         = GLFW_KEY_F9;
    _glfw.wl.keycodes[KEY_F10]        = GLFW_KEY_F10;
    _glfw.wl.keycodes[KEY_F11]        = GLFW_KEY_F11;
    _glfw.wl.keycodes[KEY_F12]        = GLFW_KEY_F12;
    _glfw.wl.keycodes[KEY_F13]        = GLFW_KEY_F13;
    _glfw.wl.keycodes[KEY_F14]        = GLFW_KEY_F14;
    _glfw.wl.keycodes[KEY_F15]        = GLFW_KEY_F15;
    _glfw.wl.keycodes[KEY_F16]        = GLFW_KEY_F16;
    _glfw.wl.keycodes[KEY_F17]        = GLFW_KEY_F17;
    _glfw.wl.keycodes[KEY_F18]        = GLFW_KEY_F18;
    _glfw.wl.keycodes[KEY_F19]        = GLFW_KEY_F19;
    _glfw.wl.keycodes[KEY_F20]        = GLFW_KEY_F20;
    _glfw.wl.keycodes[KEY_F21]        = GLFW_KEY_F21;
    _glfw.wl.keycodes[KEY_F22]        = GLFW_KEY_F22;
    _glfw.wl.keycodes[KEY_F23]        = GLFW_KEY_F23;
    _glfw.wl.keycodes[KEY_F24]        = GLFW_KEY_F24;
    _glfw.wl.keycodes[KEY_KPSLASH]    = GLFW_KEY_KP_DIVIDE;
    _glfw.wl.keycodes[KEY_KPASTERISK] = GLFW_KEY_KP_MULTIPLY;
    _glfw.wl.keycodes[KEY_KPMINUS]    = GLFW_KEY_KP_SUBTRACT;
    _glfw.wl.keycodes[KEY_KPPLUS]     = GLFW_KEY_KP_ADD;
    _glfw.wl.keycodes[KEY_KP0]        = GLFW_KEY_KP_0;
    _glfw.wl.keycodes[KEY_KP1]        = GLFW_KEY_KP_1;
    _glfw.wl.keycodes[KEY_KP2]        = GLFW_KEY_KP_2;
    _glfw.wl.keycodes[KEY_KP3]        = GLFW_KEY_KP_3;
    _glfw.wl.keycodes[KEY_KP4]        = GLFW_KEY_KP_4;
    _glfw.wl.keycodes[KEY_KP5]        = GLFW_KEY_KP_5;
    _glfw.wl.keycodes[KEY_KP6]        = GLFW_KEY_KP_6;
    _glfw.wl.keycodes[KEY_KP7]        = GLFW_KEY_KP_7;
    _glfw.wl.keycodes[KEY_KP8]        = GLFW_KEY_KP_8;
    _glfw.wl.keycodes[KEY_KP9]        = GLFW_KEY_KP_9;
    _glfw.wl.keycodes[KEY_KPDOT]      = GLFW_KEY_KP_DECIMAL;
    _glfw.wl.keycodes[KEY_KPEQUAL]    = GLFW_KEY_KP_EQUAL;
    _glfw.wl.keycodes[KEY_KPENTER]    = GLFW_KEY_KP_ENTER;
    _glfw.wl.keycodes[KEY_102ND]      = GLFW_KEY_WORLD_2;

    for (int scancode = 0;  scancode < 256;  scancode++)
    {
        if (_glfw.wl.keycodes[scancode] > 0)
            _glfw.wl.scancodes[_glfw.wl.keycodes[scancode]] = scancode;
    }
}